

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample2D
          (SampleVerifier *this,IVec3 *texelBase,Vec2 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  int i;
  long lVar1;
  long lVar2;
  double *pdVar3;
  Vec4 *pVVar4;
  Interval *x;
  Vec4 *pVVar5;
  int compNdx;
  FloatFormat *this_00;
  long lVar6;
  bool bVar7;
  float fVar8;
  Interval texelInterval;
  Interval jWeightInterval;
  Interval iWeightInterval;
  Interval resultIntervals [4];
  Vec4 texelsMax [4];
  Vec4 texelsMin [4];
  Interval local_1c8;
  Vec4 *local_1b0;
  Vec4 *local_1a8;
  Vec4 *local_1a0;
  long local_198;
  Interval local_190;
  Interval local_178;
  Interval local_160;
  Interval local_148 [4];
  Vec4 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Vec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Interval local_60;
  Interval local_48;
  
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[3] = 0.0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_e8.m_data[2] = 0.0;
  local_e8.m_data[3] = 0.0;
  lVar2 = 0;
  local_1b0 = resultMin;
  do {
    lVar6 = 0;
    do {
      local_160.m_hasNaN = SUB41((int)lVar2,0);
      local_160._1_3_ = SUB43((int)lVar2,1);
      local_160._4_4_ = (int)lVar6;
      local_160.m_lo._0_4_ = 0;
      local_148[0].m_lo._0_4_ = 0;
      local_148[0].m_hasNaN = false;
      local_148[0]._1_7_ = 0;
      lVar1 = 0;
      do {
        (&local_e8)[-6].m_data[lVar1] =
             (float)(*(int *)(&local_160.m_hasNaN + lVar1 * 4) + texelBase->m_data[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      lVar1 = lVar6 * 2 + lVar2;
      fetchTexel(this,(IVec3 *)local_148,layer,level,VK_FILTER_LINEAR,&local_a8 + lVar1,
                 &local_e8 + lVar1);
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar7);
    bVar7 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar7);
  lVar2 = 0x10;
  do {
    *(undefined1 *)((long)local_148 + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)local_148 + lVar2 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&local_148[0].m_hasNaN + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x70);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)local_148 + lVar2 + -8) = 0;
    *(undefined8 *)(&local_148[0].m_hasNaN + lVar2) = 0;
    *(undefined8 *)((long)&local_148[0].m_lo + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  this_00 = &this->m_filteringPrecision;
  pVVar4 = &local_e8;
  pVVar5 = &local_a8;
  lVar2 = 0;
  do {
    fVar8 = weights->m_data[1];
    if (lVar2 == 0) {
      fVar8 = 1.0 - fVar8;
    }
    local_178.m_hasNaN = NAN(fVar8);
    local_178.m_lo = INFINITY;
    if (!local_178.m_hasNaN) {
      local_178.m_lo = (double)fVar8;
    }
    local_178.m_hi = -INFINITY;
    if (!local_178.m_hasNaN) {
      local_178.m_hi = (double)fVar8;
    }
    tcu::FloatFormat::roundOut(&local_160,this_00,&local_178,false);
    lVar6 = 0;
    local_1a8 = pVVar5;
    local_1a0 = pVVar4;
    do {
      fVar8 = weights->m_data[0];
      if (lVar6 == 0) {
        fVar8 = 1.0 - fVar8;
      }
      local_1c8.m_hasNaN = NAN(fVar8);
      local_1c8.m_lo = INFINITY;
      if (!local_1c8.m_hasNaN) {
        local_1c8.m_lo = (double)fVar8;
      }
      local_1c8.m_hi = -INFINITY;
      if (!local_1c8.m_hasNaN) {
        local_1c8.m_hi = (double)fVar8;
      }
      local_198 = lVar6;
      tcu::operator*(&local_190,&local_160,&local_1c8);
      tcu::FloatFormat::roundOut(&local_178,this_00,&local_190,false);
      x = local_148;
      lVar6 = 0;
      do {
        local_190.m_lo = (double)pVVar5->m_data[lVar6];
        local_190.m_hi = (double)pVVar4->m_data[lVar6];
        local_190.m_hasNaN = false;
        tcu::operator*(&local_60,&local_178,&local_190);
        tcu::operator+(&local_48,x,&local_60);
        tcu::FloatFormat::roundOut(&local_1c8,this_00,&local_48,false);
        x->m_hi = local_1c8.m_hi;
        *(ulong *)x = CONCAT71(local_1c8._1_7_,local_1c8.m_hasNaN);
        x->m_lo = local_1c8.m_lo;
        lVar6 = lVar6 + 1;
        x = x + 1;
      } while (lVar6 != 4);
      lVar6 = local_198 + 1;
      pVVar4 = pVVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (local_198 == 0);
    pVVar4 = local_1a0 + 2;
    pVVar5 = local_1a8 + 2;
    bVar7 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar7);
  pdVar3 = &local_148[0].m_hi;
  lVar2 = 0;
  do {
    local_1b0->m_data[lVar2] = (float)pdVar3[-1];
    resultMax->m_data[lVar2] = (float)*pdVar3;
    lVar2 = lVar2 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar2 != 4);
  return;
}

Assistant:

void SampleVerifier::getFilteredSample2D (const IVec3&	texelBase,
										  const Vec2&	weights,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[4];
	Vec4 texelsMax[4];

	for (int i = 0; i < 2; ++i)
	{
		for (int j = 0; j < 2; ++j)
		{
		    fetchTexel(texelBase + IVec3(i, j, 0), layer, level, VK_FILTER_LINEAR, texelsMin[2 * j + i], texelsMax[2 * j + i]);
		}
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

	for (int i = 0; i < 2; ++i)
	{
		const Interval iWeightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weights[1] : weights[1]), false);

		for (int j = 0; j < 2; ++j)
		{
		    const Interval jWeightInterval = m_filteringPrecision.roundOut(iWeightInterval * Interval(j == 0 ? 1.0f - weights[0] : weights[0]), false);

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval texelInterval(false, texelsMin[2 * i + j][compNdx], texelsMax[2 * i + j][compNdx]);

				resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + jWeightInterval * texelInterval, false);
			}
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}